

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O0

Fxu_Var * Fxu_MatrixAddVar(Fxu_Matrix *p)

{
  Fxu_Var *pLink;
  Fxu_Var *pVar;
  Fxu_Matrix *p_local;
  
  pLink = (Fxu_Var *)Fxu_MemFetch(p,0x48);
  memset(pLink,0,0x48);
  pLink->iVar = (p->lVars).nItems;
  p->ppVars[pLink->iVar] = pLink;
  Fxu_ListMatrixAddVariable(p,pLink);
  return pLink;
}

Assistant:

Fxu_Var * Fxu_MatrixAddVar( Fxu_Matrix * p )
{
	Fxu_Var * pVar;
	pVar = MEM_ALLOC_FXU( p, Fxu_Var, 1 );
	memset( pVar, 0, sizeof(Fxu_Var) );
	pVar->iVar = p->lVars.nItems;
    p->ppVars[pVar->iVar] = pVar;
	Fxu_ListMatrixAddVariable( p, pVar );
	return pVar;
}